

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  MemberAccessExpressionSyntax *pMVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BumpAllocator *this;
  
  this = (BumpAllocator *)__child_stack;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x595c16);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  TVar3 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pMVar1 = BumpAllocator::
           emplace<slang::syntax::MemberAccessExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token>
                     (this,(ExpressionSyntax *)TVar2.info,TVar2._0_8_,(Token *)TVar3.info);
  return (int)pMVar1;
}

Assistant:

static SyntaxNode* clone(const MemberAccessExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<MemberAccessExpressionSyntax>(
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.dot.deepClone(alloc),
        node.name.deepClone(alloc)
    );
}